

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O1

bool checkCreterion(Mesh *mesh,VectorXd *x,double epsilon)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  PolyConnectivity *this;
  int i;
  int iVar9;
  long lVar10;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> _Var11;
  long lVar12;
  undefined8 extraout_RDX;
  long lVar13;
  long lVar14;
  undefined1 *puVar15;
  uint uVar16;
  uint uVar17;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> itr;
  long lVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double extraout_XMM1_Qa;
  double dVar22;
  double dVar23;
  double extraout_XMM1_Qb;
  double dVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined1 auVar33 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  pVar34;
  value_type e;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  Vec3d pos3d [3];
  Vec2d param [3];
  double local_1b8 [3];
  PolyConnectivity *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  double local_178 [3];
  undefined8 local_160;
  long local_158;
  VectorXd *local_150;
  undefined1 local_148 [16];
  double local_138 [4];
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  double local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  key_type local_98;
  double adStack_90 [4];
  double dStack_70;
  double local_68 [4];
  undefined1 local_48 [16];
  
  local_f8._8_4_ = in_XMM0_Dc;
  local_f8._0_8_ = epsilon;
  local_f8._12_4_ = in_XMM0_Dd;
  local_150 = x;
  initHashMap(mesh,x,epsilon);
  local_188 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  local_1a0 = (PolyConnectivity *)mesh;
  local_158 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  bVar20 = local_188._8_4_ == (int)extraout_RDX;
  bVar21 = bVar20 && local_188._0_8_ == local_158;
  dVar22 = extraout_XMM1_Qa;
  dVar27 = extraout_XMM1_Qb;
  local_160 = extraout_RDX;
  auVar26 = local_188;
  if (!bVar20 || local_188._0_8_ != local_158) {
    do {
      local_118 = local_118 -
                  (double)CONCAT44(local_98.values_._M_elems[1],local_98.values_._M_elems[0]);
      dStack_110 = dStack_110 - adStack_90[0];
      local_108 = dVar22 - (double)CONCAT44(local_98.values_._M_elems[1],
                                            local_98.values_._M_elems[0]);
      dStack_100 = dVar27 - adStack_90[0];
      if ((dStack_100 * local_118 == local_108 * dStack_110) &&
         (!NAN(dStack_100 * local_118) && !NAN(local_108 * dStack_110))) {
LAB_0013d96b:
        if (!bVar21) {
          return false;
        }
        break;
      }
      uVar2 = *(uint *)(*(long *)&local_1a0->field_0xf8 + (long)(int)local_188._8_4_ * 4);
      if (-1 < (int)uVar2) {
        lVar10 = *(long *)&local_1a0->field_0xe0;
        lVar12 = *(long *)(*(long *)(*(long *)&local_1a0->field_0x10 +
                                    (long)(int)*(BasePropHandleT<OpenMesh::VectorT<float,_3>_> *)
                                                (local_1a0 + 1) * 8) + 0x30);
        pdVar5 = (local_150->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        lVar14 = 0;
        puVar15 = local_e8;
        uVar16 = 0;
        uVar17 = uVar2;
        do {
          lVar13 = (long)((int)uVar17 >> 1) * 0x20 + lVar10;
          lVar19 = (long)*(int *)((ulong)((uVar17 & 1) << 4) + 4 + lVar13);
          lVar18 = 0;
          do {
            *(double *)(puVar15 + lVar18 * 2) = (double)*(float *)(lVar12 + lVar19 * 0xc + lVar18);
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0xc);
          pdVar1 = pdVar5 + lVar19 * 2;
          dVar22 = pdVar1[1];
          adStack_90[lVar14 * 2 + -1] = *pdVar1;
          adStack_90[lVar14 * 2] = dVar22;
          lVar14 = lVar14 + 1;
          uVar17 = *(uint *)(lVar13 + 8 + (ulong)((uVar17 & 1) << 4));
          uVar16 = uVar16 + (uVar17 == uVar2);
          puVar15 = puVar15 + 0x18;
        } while ((uVar17 != uVar2) || (uVar16 != ~uVar2 >> 0x1f));
      }
      local_198._0_8_ =
           adStack_90[1] -
           (double)CONCAT44(local_98.values_._M_elems[1],local_98.values_._M_elems[0]);
      local_198._8_8_ = adStack_90[2] - adStack_90[0];
      local_1b8[2] = (double)local_c0;
      local_1b8[0] = local_d0;
      local_1b8[1] = (double)uStack_c8;
      lVar10 = 0;
      do {
        local_1b8[lVar10] = local_1b8[lVar10] - *(double *)(local_e8 + lVar10 * 8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_178[2] = local_1b8[2];
      local_178[0] = local_1b8[0];
      local_178[1] = local_1b8[1];
      dVar22 = local_1b8[0] * local_1b8[0];
      lVar10 = 8;
      do {
        dVar22 = dVar22 + *(double *)((long)local_178 + lVar10) *
                          *(double *)((long)local_178 + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      local_188 = auVar26;
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      auVar25._8_4_ = SUB84(dVar22,0);
      auVar25._0_8_ = dVar22;
      auVar25._12_4_ = (int)((ulong)dVar22 >> 0x20);
      local_198 = divpd(local_198,auVar25);
      local_1b8[2] = (double)local_a8;
      local_1b8[0] = local_b8;
      local_1b8[1] = (double)uStack_b0;
      lVar10 = 0;
      do {
        local_1b8[lVar10] = local_1b8[lVar10] - *(double *)(local_e8 + lVar10 * 8);
        dVar22 = local_1b8[0];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_178[2] = local_1b8[2];
      local_178[0] = local_1b8[0];
      local_178[1] = local_1b8[1];
      local_1b8[2] = (double)local_c0;
      local_1b8[0] = local_d0;
      local_1b8[1] = (double)uStack_c8;
      lVar10 = 0;
      do {
        local_1b8[lVar10] = local_1b8[lVar10] - *(double *)(local_e8 + lVar10 * 8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_138[2] = local_1b8[2];
      local_138[0] = local_1b8[0];
      local_138[1] = local_1b8[1];
      uVar31 = 0;
      uVar32 = 0;
      dVar22 = dVar22 * local_1b8[0];
      lVar10 = 8;
      do {
        dVar22 = dVar22 + *(double *)((long)local_178 + lVar10) *
                          *(double *)((long)local_138 + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      local_1b8[2] = (double)local_c0;
      local_1b8[0] = local_d0;
      local_1b8[1] = (double)uStack_c8;
      lVar10 = 0;
      do {
        local_1b8[lVar10] = local_1b8[lVar10] - *(double *)(local_e8 + lVar10 * 8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_68[2] = local_1b8[2];
      local_68[0] = local_1b8[0];
      local_68[1] = local_1b8[1];
      dVar27 = local_1b8[0] * local_1b8[0];
      lVar10 = 8;
      do {
        dVar27 = dVar27 + *(double *)((long)local_68 + lVar10) *
                          *(double *)((long)local_68 + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      if (dVar27 < 0.0) {
        local_148._8_8_ = 0;
        local_148._0_8_ = dVar22;
        dVar27 = sqrt(dVar27);
        dVar22 = local_148._0_8_;
        uVar31 = local_148._8_4_;
        uVar32 = local_148._12_4_;
      }
      else {
        dVar27 = SQRT(dVar27);
      }
      local_1b8[2] = (double)local_a8;
      local_1b8[0] = local_b8;
      local_1b8[1] = (double)uStack_b0;
      lVar10 = 0;
      do {
        local_1b8[lVar10] = local_1b8[lVar10] - *(double *)(local_e8 + lVar10 * 8);
        dVar23 = local_1b8[0];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_178[2] = local_1b8[2];
      local_178[0] = local_1b8[0];
      local_178[1] = local_1b8[1];
      local_1b8[2] = (double)local_a8;
      local_1b8[0] = local_b8;
      local_1b8[1] = (double)uStack_b0;
      lVar10 = 0;
      do {
        local_1b8[lVar10] = local_1b8[lVar10] - *(double *)(local_e8 + lVar10 * 8);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_138[2] = local_1b8[2];
      local_138[0] = local_1b8[0];
      local_138[1] = local_1b8[1];
      dVar23 = dVar23 * local_1b8[0];
      lVar10 = 8;
      do {
        dVar23 = dVar23 + *(double *)((long)local_178 + lVar10) *
                          *(double *)((long)local_138 + lVar10);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      dVar22 = dVar22 / dVar27;
      dVar23 = dVar23 - dVar22 * dVar22;
      if (dVar23 < 0.0) {
        local_148._8_4_ = uVar31;
        local_148._0_8_ = dVar22;
        local_148._12_4_ = uVar32;
        dVar23 = sqrt(dVar23);
        dVar22 = (double)local_148._0_8_;
        auVar26 = local_188;
      }
      else {
        dVar23 = SQRT(dVar23);
        auVar26 = local_188;
      }
      local_188._0_8_ = auVar26._0_8_;
      auVar24._0_8_ =
           (adStack_90[3] -
           (double)CONCAT44(local_98.values_._M_elems[1],local_98.values_._M_elems[0])) -
           dVar22 * (double)local_198._0_8_;
      auVar24._8_8_ = (dStack_70 - adStack_90[0]) - dVar22 * (double)local_198._8_8_;
      auVar29._8_4_ = SUB84(dVar23,0);
      auVar29._0_8_ = dVar23;
      auVar29._12_4_ = (int)((ulong)dVar23 >> 0x20);
      auVar25 = divpd(auVar24,auVar29);
      if (auVar25._8_8_ * (double)local_198._0_8_ - (double)local_198._8_8_ * auVar25._0_8_ < 0.0)
      goto LAB_0013d96b;
      local_188._8_4_ = auVar26._8_4_;
      local_188._12_4_ = auVar26._12_4_;
      local_188._8_4_ = local_188._8_4_ + 1;
      if (local_188._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_188);
      }
      auVar26._8_8_ = local_188._8_8_;
      auVar26._0_8_ = local_188._0_8_;
      bVar21 = local_188._8_4_ == (uint)local_160 && local_188._0_8_ == local_158;
      dVar22 = local_108;
      dVar27 = dStack_100;
    } while (local_188._8_4_ != (uint)local_160 || local_188._0_8_ != local_158);
  }
  this = local_1a0;
  local_188 = auVar26;
  local_e8 = OpenMesh::PolyConnectivity::edges_begin(local_1a0);
  auVar33 = OpenMesh::PolyConnectivity::edges_end(this);
  bVar21 = true;
  if (local_e8._8_4_ != auVar33._8_4_ || local_e8._0_8_ != auVar33._0_8_) {
    local_48._8_4_ = local_f8._0_4_;
    local_48._0_8_ = local_f8._0_8_;
    local_48._12_4_ = local_f8._4_4_;
    auVar26 = local_f8;
    auVar8 = local_e8;
    do {
      auVar25 = local_198;
      local_1b8[0] = (double)CONCAT44(local_1b8[0]._4_4_,local_e8._8_4_);
      lVar10 = *(long *)&local_1a0->field_0xe0;
      lVar12 = ((long)((ulong)(uint)local_e8._8_4_ << 0x21) >> 0x21) * 0x20;
      if ((*(int *)(lVar10 + lVar12) < 0) || (*(int *)(lVar10 + 0x10 + lVar12) < 0)) {
        iVar3 = *(int *)(lVar10 + lVar12 + 0x14);
        iVar4 = *(int *)(lVar10 + lVar12 + 4);
        pdVar5 = (local_150->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        dVar22 = pdVar5[(long)iVar4 * 2];
        dVar27 = pdVar5[(long)iVar3 * 2];
        uVar7 = (ulong)dVar22 & -(ulong)(dVar27 < dVar22);
        auVar28._0_8_ = ~-(ulong)(dVar22 < dVar27) & (ulong)dVar27;
        auVar28._8_8_ = ~-(ulong)(dVar27 < dVar22) & (ulong)dVar27;
        auVar6._8_4_ = (int)uVar7;
        auVar6._0_8_ = (ulong)dVar22 & -(ulong)(dVar22 < dVar27);
        auVar6._12_4_ = (int)(uVar7 >> 0x20);
        auVar29 = divpd(auVar28 | auVar6,local_48);
        local_198._0_4_ = (undefined4)(auVar29._0_8_ + -1.0);
        iVar30 = (int)(auVar29._8_8_ + 1.0);
        lVar10 = (long)(iVar3 * 2 + 1);
        lVar12 = (long)(iVar4 * 2 + 1);
        dVar22 = pdVar5[lVar12];
        dVar27 = pdVar5[lVar10];
        dVar23 = dVar22;
        if (dVar27 <= dVar22) {
          dVar23 = dVar27;
        }
        local_198._4_4_ = 0;
        local_198._8_8_ = auVar25._8_8_;
        local_108 = (double)CONCAT44(local_108._4_4_,iVar30);
        if (iVar30 < (int)local_198._0_4_) {
          iVar9 = 8;
        }
        else {
          local_148._0_4_ = (int)(dVar23 / auVar26._0_8_ + -1.0);
          if (dVar27 < dVar22) {
            lVar10 = lVar12;
          }
          local_118 = (double)CONCAT44(local_118._4_4_,(int)(pdVar5[lVar10] / auVar26._0_8_ + 1.0));
          do {
            iVar30 = local_148._0_4_;
            if ((int)local_148._0_4_ <= local_118._0_4_) {
              do {
                local_160 = auVar33._8_8_;
                local_158 = auVar33._0_8_;
                local_98.values_._M_elems[0] = local_198._0_4_;
                local_98.values_._M_elems[1] = iVar30;
                local_e8 = auVar8;
                pVar34 = std::
                         _Hashtable<OpenMesh::VectorT<int,_2>,_std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>,_std::__detail::_Select1st,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_myHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         ::equal_range(&neighbors._M_h,&local_98);
                _Var11._M_cur =
                     (__node_type *)
                     pVar34.first.
                     super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                     ._M_cur;
                iVar9 = 0;
                bVar21 = (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                         )_Var11._M_cur ==
                         pVar34.second.
                         super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                         ._M_cur.
                         super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                ;
                auVar8 = local_e8;
                if (!bVar21) {
                  do {
                    iVar9 = *(int *)((long)&((_Var11._M_cur)->
                                            super__Hash_node_value<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>
                                            ._M_storage._M_storage + 8);
                    if ((iVar9 != iVar3) && (iVar9 != iVar4)) {
                      local_98.values_._M_elems[0] = iVar9;
                      dVar22 = getDistance((Mesh *)local_1a0,local_150,(EdgeHandle *)local_1b8,
                                           (VertexHandle *)&local_98);
                      if ((dVar22 == 0.0) && (!NAN(dVar22))) {
                        iVar9 = 1;
                        auVar8 = local_e8;
                        goto LAB_0013dba0;
                      }
                    }
                    _Var11._M_cur = (__node_type *)((_Var11._M_cur)->super__Hash_node_base)._M_nxt;
                    bVar21 = (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                              )_Var11._M_cur ==
                             pVar34.second.
                             super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                             ._M_cur.
                             super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                    ;
                  } while (!bVar21);
                  iVar9 = 0;
                  auVar8 = local_e8;
                }
LAB_0013dba0:
                auVar33._8_8_ = local_160;
                auVar33._0_8_ = local_158;
                if (!bVar21) goto LAB_0013dbc0;
                bVar21 = iVar30 != local_118._0_4_;
                iVar30 = iVar30 + 1;
              } while (bVar21);
            }
            iVar9 = 0xb;
LAB_0013dbc0:
            auVar25 = local_198;
            auVar26 = local_f8;
            if (iVar9 != 0xb) goto LAB_0013dbed;
            iVar30 = local_198._0_4_;
            local_198._4_4_ = 0;
            local_198._0_4_ = iVar30 + 1;
            local_198._8_8_ = auVar25._8_8_;
          } while (iVar30 != local_108._0_4_);
          iVar9 = 8;
        }
LAB_0013dbed:
        if (iVar9 == 8) {
          iVar9 = 0;
        }
        if (iVar9 == 0) goto LAB_0013dc00;
      }
      else {
LAB_0013dc00:
        iVar9 = 0;
      }
      local_e8._0_8_ = auVar8._0_8_;
      local_160 = auVar33._8_8_;
      local_158 = auVar33._0_8_;
      if (iVar9 != 0) goto LAB_0013dc58;
      local_e8._8_4_ = auVar8._8_4_;
      local_e8._12_4_ = auVar8._12_4_;
      local_e8._8_4_ = local_e8._8_4_ + 1;
      if (local_e8._12_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_e8);
        auVar33._8_8_ = local_160;
        auVar33._0_8_ = local_158;
        auVar26 = local_f8;
      }
      local_158 = auVar33._0_8_;
      auVar8._8_8_ = local_e8._8_8_;
      auVar8._0_8_ = local_e8._0_8_;
      local_160._0_4_ = auVar33._8_4_;
    } while (local_e8._8_4_ != (uint)local_160 || local_e8._0_8_ != local_158);
    iVar9 = 6;
LAB_0013dc58:
    bVar21 = iVar9 == 6;
  }
  return bVar21;
}

Assistant:

bool checkCreterion(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    initHashMap(mesh, x, epsilon);
    for (auto f: mesh.all_faces()) {
        // get the vertices associated with this triangle
        OpenMesh::VertexHandle vs[3];
        OpenMesh::Vec2d param[3];
        OpenMesh::Vec3d pos3d[3];
        OpenMesh::Vec2d u1 = param[1] - param[0];
        OpenMesh::Vec2d u2 = param[2] - param[0];

        if (u2[1] * u1[0] == u2[0] * u1[1])
            return false;

        int count = 0;
        for (auto v: mesh.fv_range(f)) {
            vs[count] = v;
            pos3d[count] = mesh.point(v);
            param[count] = OpenMesh::Vec2d(x[v.idx() * 2], x[v.idx() * 2 + 1]);
            ++count;
        }
        // check non-flip and bijective
        OpenMesh::Vec2d e1 = (param[1] - param[0]) / (pos3d[1] - pos3d[0]).norm();
        double xc = OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[1] - pos3d[0]) / (pos3d[1] - pos3d[0]).norm();
        double yc = sqrt(OpenMesh::dot(pos3d[2] - pos3d[0], pos3d[2] - pos3d[0]) - xc * xc);
        OpenMesh::Vec2d e2 =  (param[2] - param[0] - e1 * xc) / yc; 
        double x00 = e1[0];
        double x10 = e1[1];
        double x01 = e2[0];
        double x11 = e2[1];
        double det = x00 * x11 - x01 * x10;
        if (det < 0.0)
            return false;
    }

    // check the degeneration of boundary points
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            int st = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));
                            if (dis == 0.0)
                                return false;
                        }
                    }
        }
    return true;
}